

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanPlainScalar(Scanner *this)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>
  *pIVar4;
  iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
  local_148;
  iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
  local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  Token T;
  Twine local_d8;
  iterator local_c0;
  iterator i_1;
  iterator Tmp;
  iterator i;
  StringRef local_98;
  Twine local_88;
  uint local_6c;
  int local_68;
  uint indent;
  uint LeadingBlanks;
  uint ColStart;
  iterator Start;
  Scanner *this_local;
  undefined8 local_48;
  iterator local_40;
  StringRef *local_38;
  iterator local_30;
  iterator local_28;
  undefined1 *local_20;
  char *local_18;
  iterator *local_10;
  
  _LeadingBlanks = this->Current;
  indent = this->Column;
  local_68 = 0;
  Start = (iterator)this;
  if (this->Indent < -1) {
    __assert_fail("Indent >= -1 && \"Indent must be >= -1 !\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                  ,0x534,"bool llvm::yaml::Scanner::scanPlainScalar()");
  }
  local_6c = this->Indent + 1;
  while (*this->Current != '#') {
    while (bVar1 = isBlankOrBreak(this,this->Current), ((bVar1 ^ 0xffU) & 1) != 0) {
      if ((((this->FlowLevel != 0) && (*this->Current == ':')) &&
          (bVar1 = isBlankOrBreak(this,this->Current + 1), !bVar1)) && (this->Current[1] != ',')) {
        Twine::Twine(&local_88,"Found unexpected \':\' while scanning a plain scalar");
        setError(this,&local_88,this->Current);
        this_local._7_1_ = 0;
        goto LAB_00290c90;
      }
      if (*this->Current == ':') {
        bVar2 = isBlankOrBreak(this,this->Current + 1);
        bVar1 = true;
        if (!bVar2) goto LAB_002908bc;
      }
      else {
LAB_002908bc:
        bVar1 = false;
        if (this->FlowLevel != 0) {
          local_40 = this->Current;
          local_38 = &local_98;
          local_48 = 1;
          local_98.Length = 1;
          local_10 = &i;
          local_18 = ",:?[]{}";
          local_98.Data = local_40;
          strlen(",:?[]{}");
          sVar3 = StringRef::find_first_of(&local_98,_i,0);
          bVar1 = sVar3 != 0xffffffffffffffff;
        }
      }
      if ((bVar1) || (Tmp = skip_nb_char(this,this->Current), Tmp == this->Current)) break;
      this->Current = Tmp;
      this->Column = this->Column + 1;
    }
    bVar1 = isBlankOrBreak(this,this->Current);
    if (!bVar1) break;
    i_1 = this->Current;
    while (bVar1 = isBlankOrBreak(this,i_1), bVar1) {
      local_c0 = skip_s_white(this,i_1);
      if (local_c0 == i_1) {
        local_c0 = skip_b_break(this,i_1);
        if (local_68 == 0) {
          local_68 = 1;
        }
        this->Column = 0;
        this->Line = this->Line + 1;
        i_1 = local_c0;
      }
      else {
        if (((local_68 != 0) && (this->Column < local_6c)) && (*i_1 == '\t')) {
          Twine::Twine(&local_d8,"Found invalid tab character in indentation");
          setError(this,&local_d8,i_1);
          this_local._7_1_ = 0;
          goto LAB_00290c90;
        }
        this->Column = this->Column + 1;
        i_1 = local_c0;
      }
    }
    if ((this->FlowLevel == 0) && (this->Column < local_6c)) break;
    this->Current = i_1;
  }
  if (_LeadingBlanks == this->Current) {
    Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),"Got empty plain scalar");
    setError(this,(Twine *)((long)&T.Value.field_2 + 8),_LeadingBlanks);
    this_local._7_1_ = 0;
  }
  else {
    Token::Token((Token *)local_128);
    local_128._0_4_ = TK_Scalar;
    T.Range.Data = this->Current + -(long)_LeadingBlanks;
    local_20 = local_138;
    local_28 = _LeadingBlanks;
    T._0_8_ = _LeadingBlanks;
    local_30 = T.Range.Data;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)local_128);
    local_148.I.NodePtr =
         (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
          )AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
           ::end(&this->TokenQueue);
    pIVar4 = iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
             ::operator--(&local_148);
    local_140.I.NodePtr =
         (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
          )(pIVar4->
           super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
           ).I.NodePtr;
    saveSimpleKeyCandidate(this,(iterator)local_140.I.NodePtr,indent,false);
    this->IsSimpleKeyAllowed = false;
    this_local._7_1_ = 1;
    Token::~Token((Token *)local_128);
  }
LAB_00290c90:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Scanner::scanPlainScalar() {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  unsigned LeadingBlanks = 0;
  assert(Indent >= -1 && "Indent must be >= -1 !");
  unsigned indent = static_cast<unsigned>(Indent + 1);
  while (true) {
    if (*Current == '#')
      break;

    while (!isBlankOrBreak(Current)) {
      if (  FlowLevel && *Current == ':'
          && !(isBlankOrBreak(Current + 1) || *(Current + 1) == ',')) {
        setError("Found unexpected ':' while scanning a plain scalar", Current);
        return false;
      }

      // Check for the end of the plain scalar.
      if (  (*Current == ':' && isBlankOrBreak(Current + 1))
          || (  FlowLevel
          && (StringRef(Current, 1).find_first_of(",:?[]{}")
              != StringRef::npos)))
        break;

      StringRef::iterator i = skip_nb_char(Current);
      if (i == Current)
        break;
      Current = i;
      ++Column;
    }

    // Are we at the end?
    if (!isBlankOrBreak(Current))
      break;

    // Eat blanks.
    StringRef::iterator Tmp = Current;
    while (isBlankOrBreak(Tmp)) {
      StringRef::iterator i = skip_s_white(Tmp);
      if (i != Tmp) {
        if (LeadingBlanks && (Column < indent) && *Tmp == '\t') {
          setError("Found invalid tab character in indentation", Tmp);
          return false;
        }
        Tmp = i;
        ++Column;
      } else {
        i = skip_b_break(Tmp);
        if (!LeadingBlanks)
          LeadingBlanks = 1;
        Tmp = i;
        Column = 0;
        ++Line;
      }
    }

    if (!FlowLevel && Column < indent)
      break;

    Current = Tmp;
  }
  if (Start == Current) {
    setError("Got empty plain scalar", Start);
    return false;
  }
  Token T;
  T.Kind = Token::TK_Scalar;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  // Plain scalars can be simple keys.
  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}